

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfmt.hpp
# Opt level: O2

string * __thiscall
cpptrace::microfmt::detail::to_string_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,uint64_t value,format_options *options)

{
  char cVar1;
  char *value_00;
  
  cVar1 = *(char *)(value + 0x10);
  if (cVar1 == 'o') {
    to_string<3,7>(__return_storage_ptr__,this,0x1dea3c,(char *)options);
  }
  else if (cVar1 == 'b') {
    to_string<1,1>(__return_storage_ptr__,this,0x1dea3c,(char *)options);
  }
  else {
    if (cVar1 == 'h') {
      value_00 = "0123456789abcdef";
    }
    else {
      if (cVar1 != 'H') {
        std::__cxx11::to_string(__return_storage_ptr__,(unsigned_long)this);
        return __return_storage_ptr__;
      }
      value_00 = "0123456789ABCDEF";
    }
    to_string<4,15>(__return_storage_ptr__,this,(uint64_t)value_00,(char *)options);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(std::uint64_t value, const format_options& options) {
            switch(options.base) {
                case 'H': return to_string<4, 0xf>(value, "0123456789ABCDEF");
                case 'h': return to_string<4, 0xf>(value);
                case 'o': return to_string<3, 0x7>(value);
                case 'b': return to_string<1, 0x1>(value);
                default: return std::to_string(value); // failure: decimal
            }
        }